

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

Snapshot * __thiscall
cmState::CreatePolicyScopeSnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot)

{
  PositionType PVar1;
  PositionType it;
  ReferenceType pSVar2;
  PointerType pSVar3;
  PointerType pBVar4;
  PointerType pSVar5;
  iterator local_128;
  undefined1 local_118 [232];
  
  it = originSnapshot.Position;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*(&originSnapshot.Position);
  SnapshotDataType::SnapshotDataType((SnapshotDataType *)local_118,pSVar2);
  local_128 = cmLinkedTree<cmState::SnapshotDataType>::Push
                        (&this->SnapshotData,it,(SnapshotDataType *)local_118);
  std::__cxx11::string::~string((string *)(local_118 + 0xa8));
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_128);
  pSVar3->SnapshotType = PolicyScopeType;
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_128);
  pSVar3->Keep = false;
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_128);
  pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  (pBVar4->DirectoryEnd).Tree = local_128.Tree;
  (pBVar4->DirectoryEnd).Position = local_128.Position;
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_128);
  PVar1 = (pSVar3->Policies).Position;
  (pSVar5->PolicyScope).Tree = (pSVar3->Policies).Tree;
  (pSVar5->PolicyScope).Position = PVar1;
  __return_storage_ptr__->State = this;
  (__return_storage_ptr__->Position).Tree = local_128.Tree;
  (__return_storage_ptr__->Position).Position = local_128.Position;
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot
cmState::CreatePolicyScopeSnapshot(cmState::Snapshot originSnapshot)
{
  PositionType pos = this->SnapshotData.Push(originSnapshot.Position,
                                             *originSnapshot.Position);
  pos->SnapshotType = PolicyScopeType;
  pos->Keep = false;
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  return cmState::Snapshot(this, pos);
}